

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

int __thiscall
Js::FunctionBody::GetStatementIndexFromNativeOffset
          (FunctionBody *this,SmallSpanSequence *pThrowSpanSequence,uint32 nativeOffset)

{
  BOOL BVar1;
  int *piVar2;
  undefined1 auStack_30 [8];
  SmallSpanSequenceIter iter;
  StatementData tmpData;
  
  if (pThrowSpanSequence != (SmallSpanSequence *)0x0) {
    auStack_30._0_4_ = -1;
    auStack_30._4_4_ = 0;
    iter.accumulatedIndex = 0;
    iter.accumulatedSourceBegin = 0;
    iter.accumulatedBytecodeBegin = 0;
    iter.indexOfActualOffset = 0;
    BVar1 = SmallSpanSequence::GetMatchingStatementFromBytecode
                      (pThrowSpanSequence,nativeOffset,(SmallSpanSequenceIter *)auStack_30,
                       (StatementData *)&iter.accumulatedBytecodeBegin);
    piVar2 = &iter.accumulatedBytecodeBegin;
    if (BVar1 == 0) {
      piVar2 = (int *)(auStack_30 + 4);
    }
    return *piVar2;
  }
  return -1;
}

Assistant:

int FunctionBody::GetStatementIndexFromNativeOffset(SmallSpanSequence *pThrowSpanSequence, uint32 nativeOffset)
    {
        int statementIndex = -1;
        if (pThrowSpanSequence)
        {
            SmallSpanSequenceIter iter;
            StatementData tmpData;
            if (pThrowSpanSequence->GetMatchingStatementFromBytecode(nativeOffset, iter, tmpData))
            {
                statementIndex = tmpData.sourceBegin; // sourceBegin represents statementIndex here
            }
            else
            {
                // If nativeOffset falls on the last span, GetMatchingStatement would miss it because SmallSpanSequence
                // does not know about the last span end. Since we checked that codeAddress is within our range,
                // we can safely consider it matches the last span.
                statementIndex = iter.accumulatedSourceBegin;
            }
        }

        return statementIndex;
    }